

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
* __thiscall imrt::EvaluationFunction::get_sorted_beamlets(EvaluationFunction *this,Plan *p)

{
  double dVar1;
  double dVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  reference ppSVar6;
  reference ppVar7;
  Matrix *this_00;
  reference this_01;
  reference pvVar8;
  Plan *in_RDX;
  long in_RSI;
  multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
  *in_RDI;
  pair<imrt::Station_*,_int> pVar9;
  Matrix *Dep;
  int k;
  int o;
  pair<double,_std::pair<int,_int>_> voxel;
  iterator __end3;
  iterator __begin3;
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  *__range3;
  int i;
  double ev;
  int b;
  Station *s;
  const_iterator __end1;
  const_iterator __begin1;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__range1;
  double max_ev;
  multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
  *sorted_set;
  pair<imrt::Station_*,_int> *in_stack_fffffffffffffeb8;
  __enable_if_t<is_constructible<value_type,_pair<double,_pair<Station_*,_int>_>_>::value,_iterator>
  in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  Station *in_stack_fffffffffffffed0;
  int iStack_90;
  int iStack_8c;
  _Self local_88;
  _Self local_80;
  long local_78;
  undefined4 local_6c;
  double local_68;
  int local_5c;
  Station *local_58;
  _Self local_50;
  _Self local_48 [3];
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *local_30;
  undefined8 local_28;
  undefined1 local_19;
  Plan *local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::
  multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
  ::multimap((multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
              *)0x169906);
  local_28 = 0;
  local_30 = Plan::get_stations_abi_cxx11_(local_18);
  local_48[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::begin
                 ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                  in_stack_fffffffffffffeb8);
  local_50._M_node =
       (_List_node_base *)
       std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::end
                 ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                  in_stack_fffffffffffffeb8);
  while (bVar4 = std::operator!=(local_48,&local_50), bVar4) {
    ppSVar6 = std::_List_const_iterator<imrt::Station_*>::operator*
                        ((_List_const_iterator<imrt::Station_*> *)in_stack_fffffffffffffec0._M_node)
    ;
    local_58 = *ppSVar6;
    for (local_5c = 0; iVar3 = local_5c, iVar5 = Station::getNbBeamlets((Station *)0x1699b6),
        iVar3 < iVar5; local_5c = local_5c + 1) {
      local_68 = 0.0;
      local_6c = 0;
      local_78 = in_RSI + 0x78;
      local_80._M_node =
           (_Base_ptr)
           std::
           set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
           ::begin((set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                    *)in_stack_fffffffffffffeb8);
      local_88._M_node =
           (_Base_ptr)
           std::
           set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
           ::end((set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                  *)in_stack_fffffffffffffeb8);
      while (bVar4 = std::operator!=(&local_80,&local_88), bVar4) {
        ppVar7 = std::_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_>::operator*
                           ((_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_> *)
                            0x169a49);
        iStack_90 = (ppVar7->second).first;
        iStack_8c = (ppVar7->second).second;
        this_00 = Station::getDepositionMatrix(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
        this_01 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                *)(in_RSI + 0x150),(long)iStack_90);
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iStack_8c);
        dVar1 = *pvVar8;
        dVar2 = maths::Matrix::operator()(this_00,iStack_8c,local_5c);
        local_68 = dVar1 * dVar2 + local_68;
        std::_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<double,_std::pair<int,_int>_>_> *)
                   in_stack_fffffffffffffec0._M_node);
      }
      if ((local_68 != 0.0) || (NAN(local_68))) {
        pVar9 = std::make_pair<imrt::Station*&,int&>
                          ((Station **)in_stack_fffffffffffffec0._M_node,
                           (int *)in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffed0 = pVar9.first;
        in_stack_fffffffffffffecc = pVar9.second;
        std::make_pair<double&,std::pair<imrt::Station*,int>>
                  ((double *)in_stack_fffffffffffffec0._M_node,in_stack_fffffffffffffeb8);
        in_stack_fffffffffffffec0 =
             std::
             multimap<double,std::pair<imrt::Station*,int>,imrt::MagnitudeCompare,std::allocator<std::pair<double_const,std::pair<imrt::Station*,int>>>>
             ::insert<std::pair<double,std::pair<imrt::Station*,int>>>
                       ((multimap<double,_std::pair<imrt::Station_*,_int>,_imrt::MagnitudeCompare,_std::allocator<std::pair<const_double,_std::pair<imrt::Station_*,_int>_>_>_>
                         *)in_stack_fffffffffffffeb8,
                        (pair<double,_std::pair<imrt::Station_*,_int>_> *)0x169bd7);
      }
    }
    std::_List_const_iterator<imrt::Station_*>::operator++(local_48);
  }
  return in_RDI;
}

Assistant:

multimap < double, pair<Station*, int>, MagnitudeCompare >
EvaluationFunction::get_sorted_beamlets(Plan& p){
	//the sorted set of beamlets
	multimap < double, pair<Station*, int>, MagnitudeCompare > sorted_set;

	double max_ev=0.0;
	for(auto s:p.get_stations()){
		for(int b=0; b<s->getNbBeamlets(); b++){
			double ev=0; int i=0;
			for(auto voxel:voxels){
				int o=voxel.second.first;
				int k=voxel.second.second;
				const Matrix&  Dep = s->getDepositionMatrix(o);
				ev += D[o][k] * Dep(k,b);
			}
			if(ev==0) continue;
			sorted_set. insert(make_pair (ev,  make_pair(s,b)));
		}
	}

	return sorted_set;
}